

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_device__on_data(ma_device *pDevice,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  ma_uint32 frameCount_00;
  uint uVar1;
  ma_device_type mVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  void *pvVar10;
  
  if ((pDevice == (ma_device *)0x0) || (pDevice->state != ma_device_state_stopping)) {
    if (pDevice->noFixedSizedCallback != '\0') {
      ma_device__on_data_inner(pDevice,pFramesOut,pFramesIn,frameCount);
      return;
    }
    if (frameCount != 0) {
      uVar7 = 0;
      do {
        uVar5 = frameCount - (int)uVar7;
        uVar3 = 0;
        if (pFramesIn != (void *)0x0) {
          uVar6 = (pDevice->capture).intermediaryBufferCap;
          uVar1 = (pDevice->capture).intermediaryBufferLen;
          uVar3 = uVar6 - uVar1;
          if (uVar6 < uVar1 || uVar3 == 0) {
            uVar3 = 0;
          }
          else {
            if (uVar5 < uVar3) {
              uVar3 = uVar5;
            }
            uVar8 = (ulong)((&DAT_001be730)[(pDevice->capture).format] * (pDevice->capture).channels
                           );
            pvVar10 = (void *)(uVar8 * uVar1 + (long)(pDevice->capture).pIntermediaryBuffer);
            pvVar4 = (void *)(uVar7 * uVar8 + (long)pFramesIn);
            if ((pvVar10 != pvVar4) && (uVar8 = uVar8 * uVar3, uVar8 != 0)) {
              do {
                sVar9 = 0xffffffff;
                if (uVar8 < 0xffffffff) {
                  sVar9 = uVar8;
                }
                memcpy(pvVar10,pvVar4,sVar9);
                pvVar10 = (void *)((long)pvVar10 + sVar9);
                pvVar4 = (void *)((long)pvVar4 + sVar9);
                uVar8 = uVar8 - sVar9;
              } while (uVar8 != 0);
              uVar6 = (pDevice->capture).intermediaryBufferCap;
              uVar1 = (pDevice->capture).intermediaryBufferLen;
            }
            uVar1 = uVar1 + uVar3;
            (pDevice->capture).intermediaryBufferLen = uVar1;
          }
          if ((uVar1 == uVar6) && (pDevice->type != ma_device_type_duplex)) {
            ma_device__on_data_inner
                      (pDevice,(void *)0x0,(pDevice->capture).pIntermediaryBuffer,uVar6);
            (pDevice->capture).intermediaryBufferLen = 0;
          }
        }
        mVar2 = pDevice->type;
        uVar6 = uVar3;
        if (pFramesOut == (void *)0x0) {
LAB_001af200:
          if (mVar2 == ma_device_type_duplex) goto LAB_001af205;
        }
        else {
          uVar1 = (pDevice->playback).intermediaryBufferLen;
          if (uVar1 != 0) {
            if (uVar1 <= uVar5) {
              uVar5 = uVar1;
            }
            uVar6 = uVar5;
            if (mVar2 == ma_device_type_duplex) {
              uVar6 = uVar3;
            }
            uVar8 = (ulong)((&DAT_001be730)[(pDevice->playback).format] *
                           (pDevice->playback).channels);
            pvVar10 = (void *)(uVar7 * uVar8 + (long)pFramesOut);
            pvVar4 = (void *)(((pDevice->playback).intermediaryBufferCap - uVar1) * uVar8 +
                             (long)(pDevice->playback).pIntermediaryBuffer);
            if ((pvVar10 != pvVar4) && (uVar8 = uVar8 * uVar6, uVar8 != 0)) {
              do {
                sVar9 = 0xffffffff;
                if (uVar8 < 0xffffffff) {
                  sVar9 = uVar8;
                }
                memcpy(pvVar10,pvVar4,sVar9);
                pvVar10 = (void *)((long)pvVar10 + sVar9);
                pvVar4 = (void *)((long)pvVar4 + sVar9);
                uVar8 = uVar8 - sVar9;
              } while (uVar8 != 0);
              uVar1 = (pDevice->playback).intermediaryBufferLen;
              mVar2 = pDevice->type;
            }
            (pDevice->playback).intermediaryBufferLen = uVar1 - uVar6;
            if (uVar1 - uVar6 != 0) goto LAB_001af200;
          }
          if (mVar2 != ma_device_type_duplex) {
            ma_device__on_data_inner
                      (pDevice,(pDevice->playback).pIntermediaryBuffer,(void *)0x0,
                       (pDevice->playback).intermediaryBufferCap);
            (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
            mVar2 = pDevice->type;
            goto LAB_001af200;
          }
LAB_001af205:
          frameCount_00 = (pDevice->capture).intermediaryBufferLen;
          if (frameCount_00 == (pDevice->capture).intermediaryBufferCap) {
            ma_device__on_data_inner
                      (pDevice,(pDevice->playback).pIntermediaryBuffer,
                       (pDevice->capture).pIntermediaryBuffer,frameCount_00);
            (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
            (pDevice->capture).intermediaryBufferLen = 0;
          }
        }
        uVar6 = uVar6 + (int)uVar7;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < frameCount);
    }
  }
  return;
}

Assistant:

static void ma_device__on_data(ma_device* pDevice, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    MA_ASSERT(pDevice != NULL);

    /* Don't read more data from the client if we're in the process of stopping. */
    if (ma_device_get_state(pDevice) == ma_device_state_stopping) {
        return;
    }

    if (pDevice->noFixedSizedCallback) {
        /* Fast path. Not using a fixed sized callback. Process directly from the specified buffers. */
        ma_device__on_data_inner(pDevice, pFramesOut, pFramesIn, frameCount);
    } else {
        /* Slow path. Using a fixed sized callback. Need to use the intermediary buffer. */
        ma_uint32 totalFramesProcessed = 0;

        while (totalFramesProcessed < frameCount) {
            ma_uint32 totalFramesRemaining = frameCount - totalFramesProcessed;
            ma_uint32 framesToProcessThisIteration = 0;

            if (pFramesIn != NULL) {
                /* Capturing. Write to the intermediary buffer. If there's no room, fire the callback to empty it. */
                if (pDevice->capture.intermediaryBufferLen < pDevice->capture.intermediaryBufferCap) {
                    /* There's some room left in the intermediary buffer. Write to it without firing the callback. */
                    framesToProcessThisIteration = totalFramesRemaining;
                    if (framesToProcessThisIteration > pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen) {
                        framesToProcessThisIteration = pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen;
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferLen, pDevice->capture.format, pDevice->capture.channels),
                        ma_offset_pcm_frames_const_ptr(pFramesIn, totalFramesProcessed, pDevice->capture.format, pDevice->capture.channels),
                        framesToProcessThisIteration,
                        pDevice->capture.format, pDevice->capture.channels);

                    pDevice->capture.intermediaryBufferLen += framesToProcessThisIteration;
                }

                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    /* No room left in the intermediary buffer. Fire the data callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* We'll do the duplex data callback later after we've processed the playback data. */
                    } else {
                        ma_device__on_data_inner(pDevice, NULL, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                        /* The intermediary buffer has just been drained. */
                        pDevice->capture.intermediaryBufferLen = 0;
                    }
                }
            }

            if (pFramesOut != NULL) {
                /* Playing back. Read from the intermediary buffer. If there's nothing in it, fire the callback to fill it. */
                if (pDevice->playback.intermediaryBufferLen > 0) {
                    /* There's some content in the intermediary buffer. Read from that without firing the callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* The frames processed this iteration for a duplex device will always be based on the capture side. Leave it unmodified. */
                    } else {
                        framesToProcessThisIteration = totalFramesRemaining;
                        if (framesToProcessThisIteration > pDevice->playback.intermediaryBufferLen) {
                            framesToProcessThisIteration = pDevice->playback.intermediaryBufferLen;
                        }
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pFramesOut, totalFramesProcessed, pDevice->playback.format, pDevice->playback.channels),
                        ma_offset_pcm_frames_ptr(pDevice->playback.pIntermediaryBuffer, pDevice->playback.intermediaryBufferCap - pDevice->playback.intermediaryBufferLen, pDevice->playback.format, pDevice->playback.channels),
                        framesToProcessThisIteration,
                        pDevice->playback.format, pDevice->playback.channels);

                    pDevice->playback.intermediaryBufferLen -= framesToProcessThisIteration;
                }

                if (pDevice->playback.intermediaryBufferLen == 0) {
                    /* There's nothing in the intermediary buffer. Fire the data callback to fill it. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* In duplex mode, the data callback will be fired later. Nothing to do here. */
                    } else {
                        ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, NULL, pDevice->playback.intermediaryBufferCap);

                        /* The intermediary buffer has just been filled. */
                        pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;
                    }
                }   
            }

            /* If we're in duplex mode we might need to do a refill of the data. */
            if (pDevice->type == ma_device_type_duplex) {
                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                    pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;  /* The playback buffer will have just been filled. */
                    pDevice->capture.intermediaryBufferLen  = 0;                                        /* The intermediary buffer has just been drained. */
                }
            }

            /* Make sure this is only incremented once in the duplex case. */
            totalFramesProcessed += framesToProcessThisIteration;
        }
    }
}